

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderBuiltinConstantTests.cpp
# Opt level: O2

ShaderExecutor *
deqp::gles31::Functional::anon_unknown_1::createGetConstantExecutor
          (RenderContext *renderCtx,ShaderType shaderType,DataType dataType,string *varName,
          string *extName)

{
  bool bVar1;
  ContextType ctxType;
  ShaderExecutor *pSVar2;
  allocator<char> local_121;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  Symbol local_e0;
  undefined1 local_a8 [56];
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  ctxType.super_ApiType.m_bits = (ApiType)(*renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  local_70._M_p = (pointer)&local_60;
  local_a8._40_8_ = (pointer)0x0;
  local_a8._48_8_ = (pointer)0x0;
  local_a8._24_8_ = (pointer)0x0;
  local_a8._32_8_ = (pointer)0x0;
  local_a8._8_8_ = (pointer)0x0;
  local_a8._16_8_ = (pointer)0x0;
  local_68 = 0;
  local_60._M_local_buf[0] = '\0';
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_a8._0_4_ = bVar1 | GLSL_VERSION_310_ES;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"result = ",&local_121);
  std::operator+(&local_120,&local_100,varName);
  std::operator+(&local_e0.name,&local_120,";\n");
  std::__cxx11::string::operator=((string *)&local_50,(string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"result",&local_121);
  glu::VarType::VarType((VarType *)&local_100,dataType,PRECISION_HIGHP);
  deqp::gls::ShaderExecUtil::Symbol::Symbol(&local_e0,&local_120,(VarType *)&local_100);
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::emplace_back<deqp::gls::ShaderExecUtil::Symbol>
            ((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
              *)(local_a8 + 0x20),&local_e0);
  deqp::gls::ShaderExecUtil::Symbol::~Symbol(&local_e0);
  glu::VarType::~VarType((VarType *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  if (extName->_M_string_length == 0) goto LAB_01386f80;
  if (bVar1) {
    bVar1 = std::operator==(extName,"GL_OES_sample_variables");
    if (bVar1) goto LAB_01386f80;
    bVar1 = std::operator==(extName,"GL_EXT_geometry_shader");
    if (bVar1) goto LAB_01386f80;
    bVar1 = std::operator==(extName,"GL_EXT_tessellation_shader");
    if (bVar1) goto LAB_01386f80;
  }
  std::operator+(&local_120,"#extension ",extName);
  std::operator+(&local_e0.name,&local_120," : require\n");
  std::__cxx11::string::operator=((string *)&local_70,(string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_120);
LAB_01386f80:
  pSVar2 = deqp::gls::ShaderExecUtil::createExecutor(renderCtx,shaderType,(ShaderSpec *)local_a8);
  deqp::gls::ShaderExecUtil::ShaderSpec::~ShaderSpec((ShaderSpec *)local_a8);
  return pSVar2;
}

Assistant:

static gls::ShaderExecUtil::ShaderExecutor* createGetConstantExecutor (const glu::RenderContext&	renderCtx,
																	   glu::ShaderType				shaderType,
																	   glu::DataType				dataType,
																	   const std::string&			varName,
																	   const std::string&			extName)
{
	using namespace gls::ShaderExecUtil;

	const bool	supportsES32	= contextSupports(renderCtx.getType(), glu::ApiType::es(3, 2));
	ShaderSpec	shaderSpec;

	shaderSpec.version	= supportsES32 ? glu::GLSL_VERSION_320_ES : glu::GLSL_VERSION_310_ES;
	shaderSpec.source	= string("result = ") + varName + ";\n";

	shaderSpec.outputs.push_back(Symbol("result", glu::VarType(dataType, glu::PRECISION_HIGHP)));

	if (!extName.empty() && !(supportsES32 && (extName == "GL_OES_sample_variables" || extName == "GL_EXT_geometry_shader" || extName == "GL_EXT_tessellation_shader")))
		shaderSpec.globalDeclarations = "#extension " + extName + " : require\n";

	return createExecutor(renderCtx, shaderType, shaderSpec);
}